

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t match_list_unmatched_inclusions_next
                  (archive_match *a,match_list *list,wchar_t mbs,void **vp)

{
  int iVar1;
  match *pmVar2;
  bool bVar3;
  wchar_t wVar4;
  int *piVar5;
  match *pmVar6;
  wchar_t unaff_R13D;
  char *p;
  wchar_t *local_50;
  archive_match *local_48;
  match **local_40;
  void **local_38;
  
  *vp = (void *)0x0;
  if (list->unmatched_eof == L'\0') {
    if (list->unmatched_next == (match *)0x0) {
      if (list->unmatched_count == L'\0') goto LAB_0052ff0c;
      list->unmatched_next = list->first;
    }
    pmVar6 = (match *)&list->unmatched_next;
    local_48 = a;
    local_40 = (match **)pmVar6;
    local_38 = vp;
    do {
      pmVar6 = pmVar6->next;
      if (pmVar6 == (match *)0x0) {
        *local_40 = (match *)0x0;
        goto LAB_0052ff0c;
      }
      iVar1 = pmVar6->matches;
      if (iVar1 == 0) {
        if (mbs == L'\0') {
          wVar4 = archive_mstring_get_wcs(&a->archive,&pmVar6->pattern,&local_50);
          if ((L'\xffffffff' < wVar4) || (piVar5 = __errno_location(), *piVar5 != 0xc)) {
            if (local_50 == (wchar_t *)0x0) {
              local_50 = anon_var_dwarf_12140ee + 6;
            }
            goto LAB_0052febf;
          }
LAB_0052fe78:
          a = local_48;
          bVar3 = false;
          archive_set_error(&local_48->archive,0xc,"No memory");
          (a->archive).state = 0x8000;
          unaff_R13D = L'\xffffffe2';
        }
        else {
          wVar4 = archive_mstring_get_mbs(&a->archive,&pmVar6->pattern,(char **)&local_50);
          if ((wVar4 < L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) goto LAB_0052fe78;
          if (local_50 == (wchar_t *)0x0) {
            local_50 = L"";
          }
LAB_0052febf:
          *local_38 = local_50;
          bVar3 = true;
          a = local_48;
        }
        if (bVar3) {
          pmVar2 = pmVar6->next;
          *local_40 = pmVar2;
          unaff_R13D = L'\0';
          if (pmVar2 == (match *)0x0) {
            list->unmatched_eof = L'\x01';
          }
        }
      }
    } while (iVar1 != 0);
  }
  else {
    list->unmatched_eof = L'\0';
LAB_0052ff0c:
    unaff_R13D = L'\x01';
  }
  return unaff_R13D;
}

Assistant:

static int
match_list_unmatched_inclusions_next(struct archive_match *a,
    struct match_list *list, int mbs, const void **vp)
{
	struct match *m;

	*vp = NULL;
	if (list->unmatched_eof) {
		list->unmatched_eof = 0;
		return (ARCHIVE_EOF);
	}
	if (list->unmatched_next == NULL) {
		if (list->unmatched_count == 0)
			return (ARCHIVE_EOF);
		list->unmatched_next = list->first;
	}

	for (m = list->unmatched_next; m != NULL; m = m->next) {
		int r;

		if (m->matches)
			continue;
		if (mbs) {
			const char *p;
			r = archive_mstring_get_mbs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = "";
			*vp = p;
		} else {
			const wchar_t *p;
			r = archive_mstring_get_wcs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = L"";
			*vp = p;
		}
		list->unmatched_next = m->next;
		if (list->unmatched_next == NULL)
			/* To return EOF next time. */
			list->unmatched_eof = 1;
		return (ARCHIVE_OK);
	}
	list->unmatched_next = NULL;
	return (ARCHIVE_EOF);
}